

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O3

void rgbcx::unpack_bc4(void *pBlock_bits,uint8_t *pPixels,uint32_t stride)

{
  uint6 uVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  byte local_10 [4];
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  uint8_t sel_values [8];
  
  local_10[0] = *pBlock_bits;
  uVar4 = (uint)local_10[0];
  local_10[1] = *(byte *)((long)pBlock_bits + 1);
  uVar5 = (uint)local_10[1];
  if (local_10[1] < local_10[0]) {
    local_10[2] = (byte)((uVar5 + uVar4 * 6) * 0x2493 >> 0x10);
    local_10[3] = (byte)(((uint)local_10[1] + (uint)local_10[1] + uVar4 * 5) / 7);
    local_c = (undefined1)((uVar5 * 3 + uVar4 * 4) * 0x2493 >> 0x10);
    local_b = (undefined1)((uVar4 * 3 + uVar5 * 4) * 0x2493 >> 0x10);
    local_a = (undefined1)((uVar5 * 5 + uVar4 * 2) / 7);
    local_9 = (undefined1)((uVar4 + uVar5 * 6) * 0x2493 >> 0x10);
  }
  else {
    local_10[2] = (byte)((uVar5 + uVar4 * 4) * 0x3334 >> 0x10);
    local_10[3] = (byte)(((uint)local_10[1] + (uint)local_10[1] + uVar4 * 3) / 5);
    local_c = (undefined1)((uVar5 * 3 + uVar4 * 2) * 0x3334 >> 0x10);
    local_b = (undefined1)((uVar4 + uVar5 * 4) * 0x3334 >> 0x10);
    local_9 = 0xff;
    local_a = 0;
  }
  uVar1 = *(uint6 *)((long)pBlock_bits + 2);
  lVar3 = 9;
  do {
    bVar2 = (byte)lVar3;
    *pPixels = local_10[(uint)(uVar1 >> (bVar2 - 9 & 0x3f)) & 7];
    pPixels[stride] = local_10[(uint)(uVar1 >> (bVar2 - 6 & 0x3f)) & 7];
    pPixels[stride * 2] = local_10[(uint)(uVar1 >> (bVar2 - 3 & 0x3f)) & 7];
    pPixels[stride * 3] = local_10[(uint)(uVar1 >> (bVar2 & 0x3f)) & 7];
    pPixels = pPixels + (stride << 2);
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x39);
  return;
}

Assistant:

void unpack_bc4(const void* pBlock_bits, uint8_t* pPixels, uint32_t stride)
	{
		static_assert(sizeof(bc4_block) == 8, "sizeof(bc4_block) == 8");

		const bc4_block* pBlock = static_cast<const bc4_block*>(pBlock_bits);

		uint8_t sel_values[8];
		bc4_block::get_block_values(sel_values, pBlock->get_low_alpha(), pBlock->get_high_alpha());

		const uint64_t selector_bits = pBlock->get_selector_bits();

		for (uint32_t y = 0; y < 4; y++, pPixels += (stride * 4U))
		{
			pPixels[0] = sel_values[pBlock->get_selector(0, y, selector_bits)];
			pPixels[stride * 1] = sel_values[pBlock->get_selector(1, y, selector_bits)];
			pPixels[stride * 2] = sel_values[pBlock->get_selector(2, y, selector_bits)];
			pPixels[stride * 3] = sel_values[pBlock->get_selector(3, y, selector_bits)];
		}
	}